

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metric_manager.hpp
# Opt level: O2

shared_ptr<ylt::metric::basic_static_gauge<long>_> __thiscall
ylt::metric::static_metric_manager<ylt::metric::ylt_default_metric_tag_t>::
get_metric_static<ylt::metric::basic_static_gauge<long>>
          (static_metric_manager<ylt::metric::ylt_default_metric_tag_t> *this,string *name)

{
  iterator iVar1;
  key_type *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  shared_ptr<ylt::metric::basic_static_gauge<long>_> sVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  
  iVar1 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ylt::metric::static_metric>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ylt::metric::static_metric>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ylt::metric::static_metric>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ylt::metric::static_metric>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)name,in_RDX);
  if (iVar1.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ylt::metric::static_metric>_>,_true>
      ._M_cur == (__node_type *)0x0) {
    (this->metric_map_)._M_h._M_buckets = (__buckets_ptr)0x0;
    (this->metric_map_)._M_h._M_bucket_count = 0;
    _Var2._M_pi = extraout_RDX;
  }
  else {
    sVar3 = std::
            dynamic_pointer_cast<ylt::metric::basic_static_gauge<long>,ylt::metric::static_metric>
                      ((shared_ptr<ylt::metric::static_metric> *)this);
    _Var2 = sVar3.
            super___shared_ptr<ylt::metric::basic_static_gauge<long>,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  }
  sVar3.super___shared_ptr<ylt::metric::basic_static_gauge<long>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var2._M_pi;
  sVar3.super___shared_ptr<ylt::metric::basic_static_gauge<long>,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (shared_ptr<ylt::metric::basic_static_gauge<long>_>)
         sVar3.super___shared_ptr<ylt::metric::basic_static_gauge<long>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

std::shared_ptr<T> get_metric_static(const std::string& name) {
    static_assert(std::is_base_of_v<static_metric, T>,
                  "must be dynamic metric");
    auto it = metric_map_.find(name);
    if (it == metric_map_.end()) {
      return nullptr;
    }
    return std::dynamic_pointer_cast<T>(it->second);
  }